

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

SDL_bool ResetAudioStream(SDL_AudioStream **_stream,SDL_AudioSpec *spec,SDL_AudioSpec *to,
                         SDL_AudioFormat fromfmt,Uint8 fromchannels,int fromfreq)

{
  SDL_AudioStream *pSVar1;
  Uint8 *pUVar2;
  void *ptr;
  int fromfreq_local;
  Uint8 fromchannels_local;
  SDL_AudioFormat fromfmt_local;
  SDL_AudioSpec *to_local;
  SDL_AudioSpec *spec_local;
  SDL_AudioStream **_stream_local;
  
  if ((((*_stream == (SDL_AudioStream *)0x0) || (spec->channels != fromchannels)) ||
      (spec->format != fromfmt)) || (spec->freq != fromfreq)) {
    (*SDL20_FreeAudioStream)(*_stream);
    pSVar1 = (*SDL20_NewAudioStream)(fromfmt,fromchannels,fromfreq,to->format,to->channels,to->freq)
    ;
    *_stream = pSVar1;
    if (*_stream == (SDL_AudioStream *)0x0) {
      return SDL_FALSE;
    }
    spec->channels = fromchannels;
    spec->format = fromfmt;
    spec->freq = fromfreq;
    spec->size = (uint)spec->samples * (uint)spec->channels * ((spec->format & 0xff) / 8);
    if (audio_cbdata->mixbuflen < (ulong)spec->size) {
      pUVar2 = (Uint8 *)(*SDL20_realloc)(audio_cbdata->mix_buffer,(size_t)spec->size);
      if (pUVar2 == (Uint8 *)0x0) {
        (*SDL20_FreeAudioStream)(*_stream);
        *_stream = (SDL_AudioStream *)0x0;
        (*SDL20_Error)(SDL_ENOMEM);
        return SDL_FALSE;
      }
      audio_cbdata->mixbuflen = (ulong)spec->size;
      audio_cbdata->mix_buffer = pUVar2;
    }
  }
  return SDL_TRUE;
}

Assistant:

static SDL_bool
ResetAudioStream(SDL_AudioStream **_stream, SDL_AudioSpec *spec, const SDL_AudioSpec *to, const SDL_AudioFormat fromfmt, const Uint8 fromchannels, const int fromfreq)
{
    if ((!*_stream) || (spec->channels != fromchannels) || (spec->format != fromfmt) || (spec->freq != fromfreq)) {
        SDL20_FreeAudioStream(*_stream);
        *_stream = SDL20_NewAudioStream(fromfmt, fromchannels, fromfreq, to->format, to->channels, to->freq);
        if (!*_stream) {
            return SDL_FALSE;
        }

        spec->channels = fromchannels;
        spec->format = fromfmt;
        spec->freq = fromfreq;
        spec->size = spec->samples * spec->channels * (SDL_AUDIO_BITSIZE(spec->format) / 8);

        if (audio_cbdata->mixbuflen < spec->size) {
            void *ptr = SDL20_realloc(audio_cbdata->mix_buffer, spec->size);
            if (!ptr) {
                SDL20_FreeAudioStream(*_stream);
                *_stream = NULL;
                SDL20_OutOfMemory();
                return SDL_FALSE;
            }
            audio_cbdata->mixbuflen = spec->size;
            audio_cbdata->mix_buffer = (Uint8 *) ptr;
        }
    }
    return SDL_TRUE;
}